

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

FSM * __thiscall
kratos::Generator::fsm
          (Generator *this,string *fsm_name,shared_ptr<kratos::Var> *clk,
          shared_ptr<kratos::Var> *reset)

{
  iterator iVar1;
  UserException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  string_view format_str;
  format_args args;
  string local_78;
  undefined1 auStack_58 [8];
  shared_ptr<kratos::FSM> p;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSM>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSM>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSM>_>_>_>
          ::find(&(this->fsms_)._M_t,fsm_name);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->fsms_)._M_t._M_impl.super__Rb_tree_header) {
    local_78._M_dataplus._M_p = (pointer)this;
    std::
    make_shared<kratos::FSM,std::__cxx11::string_const&,kratos::Generator*,std::shared_ptr<kratos::Var>const&,std::shared_ptr<kratos::Var>const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_58,
               (Generator **)fsm_name,(shared_ptr<kratos::Var> *)&local_78,clk);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::FSM>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::FSM>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::FSM>>>>
    ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<kratos::FSM>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::FSM>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::FSM>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::FSM>>>>
                *)&this->fsms_,fsm_name,(shared_ptr<kratos::FSM> *)auStack_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p);
    return (FSM *)auStack_58;
  }
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  auStack_58 = (undefined1  [8])(fsm_name->_M_dataplus)._M_p;
  p.super___shared_ptr<kratos::FSM,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)fsm_name->_M_string_length;
  p.super___shared_ptr<kratos::FSM,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->name)._M_dataplus._M_p;
  bVar2 = fmt::v7::to_string_view<char,_0>("FSM {0} already exists in {1}");
  format_str.data_ = (char *)bVar2.size_;
  format_str.size_ = 0xdd;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)auStack_58;
  fmt::v7::detail::vformat_abi_cxx11_(&local_78,(detail *)bVar2.data_,format_str,args);
  UserException::UserException(this_00,&local_78);
  __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

FSM &Generator::fsm(const std::string &fsm_name, const std::shared_ptr<Var> &clk,
                    const std::shared_ptr<Var> &reset) {
    if (fsms_.find(fsm_name) != fsms_.end())
        throw UserException(::format("FSM {0} already exists in {1}", fsm_name, name));
    auto p = std::make_shared<FSM>(fsm_name, this, clk, reset);
    fsms_.emplace(fsm_name, p);
    return *p;
}